

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_16a64::AckermannTask::start(AckermannTask *this,TaskInterface ti)

{
  TaskInterface local_40;
  int local_30;
  int local_2c;
  KeyType local_28;
  
  local_40.ctx = ti.ctx;
  local_40.impl = ti.impl;
  local_30 = this->m;
  if (local_30 != 0) {
    if (this->n == 0) {
      local_30 = local_30 + -1;
      local_2c = 1;
    }
    else {
      local_2c = this->n + -1;
    }
    (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
              (&local_28,(AckermannKey *)&local_30);
    llbuild::core::TaskInterface::request(&local_40,&local_28,0);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void start(core::TaskInterface ti) override {
    // Request the first recursive result, if necessary.
    if (m == 0) {
      ;
    } else if (n == 0) {
      ti.request(AckermannKey(m-1, 1), 0);
    } else {
      ti.request(AckermannKey(m, n-1), 0);
    }
  }